

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O3

Response * __thiscall
iqxmlrpc::Client_base::execute
          (Response *__return_storage_ptr__,Client_base *this,string *method,Param_list *pl,
          XHeaders *xheaders)

{
  Impl *pIVar1;
  Client_connection *pCVar2;
  Auto_conn conn;
  Request req;
  Auto_conn local_68;
  Request local_50;
  
  Request::Request(&local_50,method,pl);
  Auto_conn::Auto_conn(&local_68,(this->impl_).px,this);
  pIVar1 = (this->impl_).px;
  if (pIVar1 != (Impl *)0x0) {
    (local_68.conn_ptr_)->options = &pIVar1->opts;
    Client_connection::process_session(__return_storage_ptr__,local_68.conn_ptr_,&local_50,xheaders)
    ;
    if (((local_68.client_impl_)->opts).keep_alive_ == false) {
      pCVar2 = ((local_68.client_impl_)->conn_cache).px;
      ((local_68.client_impl_)->conn_cache).px = (Client_connection *)0x0;
      if (pCVar2 != (Client_connection *)0x0) {
        (*pCVar2->_vptr_Client_connection[1])();
      }
    }
    if (local_68.tmp_conn_.px != (Client_connection *)0x0) {
      (*(local_68.tmp_conn_.px)->_vptr_Client_connection[1])();
    }
    std::vector<iqxmlrpc::Value,_std::allocator<iqxmlrpc::Value>_>::~vector(&local_50.params);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.name._M_dataplus._M_p != &local_50.name.field_2) {
      operator_delete(local_50.name._M_dataplus._M_p,local_50.name.field_2._M_allocated_capacity + 1
                     );
    }
    return __return_storage_ptr__;
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/scoped_ptr.hpp",0x69,
                "T *boost::scoped_ptr<iqxmlrpc::Client_base::Impl>::operator->() const [T = iqxmlrpc::Client_base::Impl]"
               );
}

Assistant:

Response Client_base::execute(
  const std::string& method, const Param_list& pl, const XHeaders& xheaders )
{
  Request req( method, pl );

  Auto_conn conn( *impl_.get(), *this );
  conn->set_options(impl_->opts);

  return conn->process_session( req, xheaders );
}